

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

Adjacency_Graph<false> * __thiscall
Disa::Adjacency_Graph<false>::reorder
          (Adjacency_Graph<false> *__return_storage_ptr__,Adjacency_Graph<false> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permutation)

{
  pointer puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  double dVar4;
  pointer puVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  pointer puVar9;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  unsigned_long uVar12;
  ulong uVar13;
  long lVar14;
  pointer puVar15;
  pointer puVar16;
  difference_type __d;
  undefined1 auVar17 [16];
  double dVar18;
  undefined **local_140;
  size_type local_138;
  undefined *local_130;
  undefined8 uStack_128;
  Adjacency_Graph<false> *local_120;
  pointer local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  puVar15 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar9 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar16 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start;
  puVar1 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  location = (source_location *)0x0;
  if (puVar9 != puVar15) {
    location = (source_location *)(((long)puVar9 - (long)puVar15 >> 3) + -1);
  }
  if ((source_location *)((long)puVar1 - (long)puVar16 >> 3) == location) {
    dVar4 = 0.0;
    for (; puVar16 != puVar1; puVar16 = puVar16 + 1) {
      dVar4 = dVar4 + ((double)CONCAT44(0x45300000,(int)(*puVar16 >> 0x20)) - 1.9342813113834067e+25
                      ) + ((double)CONCAT44(0x43300000,(int)*puVar16) - 4503599627370496.0);
    }
    lVar11 = (long)((long)&location[-1]._M_impl + 7) * (long)location;
    auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar17._0_8_ = lVar11;
    auVar17._12_4_ = 0x45300000;
    dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 0.5;
    if ((dVar4 == dVar18) && (!NAN(dVar4) && !NAN(dVar18))) {
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->offset,
                 (long)(this->offset).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar15 >> 3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->vertex_adjacent_list,
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      puVar15 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15;
      if (8 < uVar6) {
        puVar9 = (__return_storage_ptr__->offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *puVar9 = 0;
        lVar11 = (long)uVar6 >> 3;
        if (lVar11 != 1) {
          puVar16 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = 1;
          do {
            puVar9[puVar16[lVar14 + -1] + 1] = puVar15[lVar14] - puVar15[lVar14 + -1];
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
          uVar12 = *puVar9;
          lVar14 = 1;
          do {
            uVar12 = uVar12 + puVar9[lVar14];
            puVar9[lVar14] = uVar12;
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
      }
      puVar15 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((long)puVar9 - (long)puVar15 != 8 && puVar9 != puVar15) {
        uVar6 = 0;
        local_120 = this;
        do {
          local_118 = (permutation->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          uVar12 = puVar15[uVar6];
          uVar2 = puVar15[uVar6 + 1];
          puVar15 = (local_120->vertex_adjacent_list).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar3 = (__return_storage_ptr__->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_118[uVar6]];
          puVar9 = (__return_storage_ptr__->vertex_adjacent_list).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,permutation);
          if (uVar12 != uVar2) {
            lVar11 = 0;
            do {
              *(unsigned_long *)((long)puVar9 + lVar11 + uVar3 * 8) =
                   local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [*(long *)((long)puVar15 + lVar11 + uVar12 * 8)];
              lVar11 = lVar11 + 8;
            } while (uVar2 * 8 + uVar12 * -8 != lVar11);
          }
          if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          puVar15 = (__return_storage_ptr__->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = puVar15[local_118[uVar6]];
          uVar2 = puVar15[local_118[uVar6] + 1];
          if (uVar12 != uVar2) {
            puVar9 = (__return_storage_ptr__->vertex_adjacent_list).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar15 = puVar9 + uVar12;
            puVar9 = puVar9 + uVar2;
            uVar13 = (long)(uVar2 * 8 + uVar12 * -8) >> 3;
            lVar11 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar15,puVar9,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar15,puVar9);
          }
          puVar15 = (local_120->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar9 = (local_120->offset).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          this = local_120;
        } while (((long)puVar9 - (long)puVar15 != 0) &&
                (uVar6 = uVar6 + 1, uVar6 < ((long)puVar9 - (long)puVar15 >> 3) - 1U));
      }
      puVar1 = (this->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar16 = (this->vertex_adjacent_list).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (__return_storage_ptr__->vertex_adjacent_list).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->vertex_adjacent_list).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->vertex_adjacent_list).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar1;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar16;
      puVar16 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar15;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar16;
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_140 = &PTR_s__workspace_llm4binary_github_lic_00164d10;
    console_format_abi_cxx11_(&local_f0,(Disa *)0x0,(Log_Level)&local_140,location);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"Checksum for parsed re_ordering failed, are the elements unique?",0x40);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_38 = &PTR_s__workspace_llm4binary_github_lic_00164cf8;
    console_format_abi_cxx11_(&local_f0,(Disa *)0x0,(Log_Level)&local_38,location);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__cxx11::to_string
              (&local_98,
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_78,"Incorrect sizes, ",&local_98);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_78," vs. ");
    local_110._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar10) {
      local_110.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_110._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    puVar15 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    puVar9 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = ((long)puVar15 - (long)puVar9 >> 3) - 1;
    if (puVar15 == puVar9) {
      uVar12 = 0;
    }
    std::__cxx11::to_string(&local_b8,uVar12);
    std::operator+(&local_58,&local_110,&local_b8);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_58,".");
    local_140 = (undefined **)(pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140 == paVar10) {
      local_130 = (undefined *)paVar10->_M_allocated_capacity;
      uStack_128 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_140 = &local_130;
    }
    else {
      local_130 = (undefined *)paVar10->_M_allocated_capacity;
    }
    local_138 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_140,local_138);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  exit(1);
}

Assistant:

Adjacency_Graph<_directed> Adjacency_Graph<_directed>::reorder(const std::vector<std::size_t>& permutation) {

  ASSERT_DEBUG(permutation.size() == size_vertex(), "Incorrect sizes, " + std::to_string(permutation.size()) + " vs. " +
                                                    std::to_string(size_vertex()) + ".");
  ASSERT_DEBUG(
  std::accumulate(permutation.begin(), permutation.end(), 0.0) == (size_vertex() - 1) * size_vertex() / 2.0,
  "Checksum for parsed re_ordering failed, are the elements unique?");

  // Allocate memory.
  Adjacency_Graph graph;
  graph.offset.resize(offset.size());
  graph.vertex_adjacent_list.resize(vertex_adjacent_list.size());

  // Set up the offsets for the new graph.
  if(!empty()) {
    graph.offset[0] = 0;
    FOR(i_old, size_vertex()) graph.offset[permutation[i_old] + 1] = offset[i_old + 1] - offset[i_old];
    FOR(i_new, size_vertex()) graph.offset[i_new + 1] += graph.offset[i_new];
  }

  // Populate the new graph using the reorder mapping.
  FOR(i_old, size_vertex()) {
    const std::size_t& i_new = permutation[i_old];
    auto adjacency_iter = vertex_adjacency_iter(i_old);
    std::transform(adjacency_iter.first, adjacency_iter.second,
                   std::next(graph.vertex_adjacent_list.begin(), static_cast<s_size_t>(graph.offset[i_new])),
                   [permutation](const std::size_t& i_old) { return permutation[i_old]; });
    adjacency_iter = graph.vertex_adjacency_iter(i_new);
    std::sort(adjacency_iter.first, adjacency_iter.second);
  }

  // swap class data and return.
  this->swap(graph);
  return graph;
}